

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void av1_filter_block_plane_horz
               (AV1_COMMON *cm,MACROBLOCKD *xd,int plane,MACROBLOCKD_PLANE *plane_ptr,
               uint32_t mi_row,uint32_t mi_col)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  long in_RCX;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint32_t in_stack_00000018;
  EDGE_DIR in_stack_0000001f;
  MACROBLOCKD *in_stack_00000020;
  AV1_DEBLOCKING_PARAMETERS params;
  AV1_DEBLOCKING_PARAMETERS *in_stack_00000038;
  TX_SIZE tx_size;
  uint32_t advance_units;
  uint32_t curr_y;
  uint32_t curr_x;
  int y;
  uint8_t *p;
  int x;
  int x_range;
  int y_range;
  int plane_mi_cols;
  int plane_mi_rows;
  int dst_stride;
  uint8_t *dst_ptr;
  uint32_t scale_vert;
  uint32_t scale_horz;
  uint32_t in_stack_000000c0;
  int in_stack_000000c8;
  macroblockd_plane *in_stack_000000d0;
  int local_88;
  int local_84;
  undefined1 local_80 [23];
  byte local_69;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  uint8_t *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int iVar5;
  AV1_DEBLOCKING_PARAMETERS *params_00;
  int dst_stride_00;
  
  dst_stride_00 = *(int *)(in_RCX + 4);
  params_00 = *(AV1_DEBLOCKING_PARAMETERS **)(in_RCX + 0x10);
  iVar5 = *(int *)(in_RCX + 0x28);
  bVar3 = (byte)*(undefined4 *)(in_RCX + 8);
  iVar1 = *(int *)(in_RDI + 0x214) + ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f);
  bVar4 = (byte)dst_stride_00;
  iVar2 = *(int *)(in_RDI + 0x218) + ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f);
  if ((int)(iVar1 - (in_R8D >> (bVar3 & 0x1f))) < 0x20 >> (bVar3 & 0x1f)) {
    local_84 = iVar1 - (in_R8D >> (bVar3 & 0x1f));
  }
  else {
    local_84 = 0x20 >> (bVar3 & 0x1f);
  }
  local_48 = local_84;
  if ((int)(iVar2 - (in_R9D >> (bVar4 & 0x1f))) < 0x20 >> (bVar4 & 0x1f)) {
    local_88 = iVar2 - (in_R9D >> (bVar4 & 0x1f));
  }
  else {
    local_88 = 0x20 >> (bVar4 & 0x1f);
  }
  local_4c = local_88;
  for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
    local_58 = &params_00->filter_length + (local_50 << 2);
    for (local_5c = 0; local_5c < local_48; local_5c = local_68 + local_5c) {
      local_60 = ((in_R9D << 2) >> ((byte)dst_stride_00 & 0x1f)) + local_50 * 4;
      local_64 = ((in_R8D << 2) >> (bVar3 & 0x1f)) + local_5c * 4;
      memset(local_80,0,0x10);
      local_69 = set_lpf_parameters(in_stack_00000038,(ptrdiff_t)params.lfthr,
                                    (AV1_COMMON *)params._0_8_,in_stack_00000020,in_stack_0000001f,
                                    in_stack_00000018,in_stack_000000c0,in_stack_000000c8,
                                    in_stack_000000d0);
      if (local_69 == 0xff) {
        local_80[0] = 0;
        local_69 = 0;
      }
      filter_horz((uint8_t *)CONCAT44(in_R8D,in_R9D),dst_stride_00,params_00,
                  (SequenceHeader *)CONCAT44(iVar5,iVar1),(USE_FILTER_TYPE)((uint)iVar2 >> 0x18));
      local_68 = tx_size_high_unit[local_69];
      local_58 = local_58 + (uint)(local_68 * iVar5 * 4);
    }
  }
  return;
}

Assistant:

void av1_filter_block_plane_horz(const AV1_COMMON *const cm,
                                 const MACROBLOCKD *const xd, const int plane,
                                 const MACROBLOCKD_PLANE *const plane_ptr,
                                 const uint32_t mi_row, const uint32_t mi_col) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  const int plane_mi_rows =
      ROUND_POWER_OF_TWO(cm->mi_params.mi_rows, scale_vert);
  const int plane_mi_cols =
      ROUND_POWER_OF_TWO(cm->mi_params.mi_cols, scale_horz);
  const int y_range = AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
                             (MAX_MIB_SIZE >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  for (int x = 0; x < x_range; x++) {
    uint8_t *p = dst_ptr + x * MI_SIZE;
    for (int y = 0; y < y_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will first filter the vertical edge aligned with a 8x8
      // block. If 4x4 transform is used, it will then filter the internal
      // edge aligned with a 4x4 block
      const uint32_t curr_x = ((mi_col * MI_SIZE) >> scale_horz) + x * MI_SIZE;
      const uint32_t curr_y = ((mi_row * MI_SIZE) >> scale_vert) + y * MI_SIZE;
      uint32_t advance_units;
      TX_SIZE tx_size;
      AV1_DEBLOCKING_PARAMETERS params;
      memset(&params, 0, sizeof(params));

      tx_size = set_lpf_parameters(
          &params, (cm->mi_params.mi_stride << scale_vert), cm, xd, HORZ_EDGE,
          curr_x, curr_y, plane, plane_ptr);
      if (tx_size == TX_INVALID) {
        params.filter_length = 0;
        tx_size = TX_4X4;
      }

      filter_horz(p, dst_stride, &params, cm->seq_params, USE_SINGLE);

      // advance the destination pointer
      advance_units = tx_size_high_unit[tx_size];
      y += advance_units;
      p += advance_units * dst_stride * MI_SIZE;
    }
  }
}